

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

void FunctionDef::accessToJson(QJsonObject *obj,Access acs)

{
  long lVar1;
  QLatin1StringView s;
  QLatin1StringView s_00;
  int in_ESI;
  QJsonValue *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QJsonValue *in_stack_fffffffffffffee8;
  size_t in_stack_fffffffffffffef0;
  QJsonValue *in_stack_fffffffffffffef8;
  QJsonValueRef *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  QLatin1StringView in_stack_ffffffffffffff20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    QVar2.m_size._0_4_ = in_stack_ffffffffffffff08;
    QVar2.m_data = (char *)in_stack_ffffffffffffff00;
    QVar2.m_size._4_4_ = in_ESI;
    QJsonValue::QJsonValue(in_stack_fffffffffffffee8,QVar2);
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    QJsonObject::operator[]((QJsonObject *)in_stack_fffffffffffffef8,in_stack_ffffffffffffff20);
    QJsonValueRef::operator=((QJsonValueRef *)in_RDI,in_stack_fffffffffffffef8);
    QJsonValue::~QJsonValue((QJsonValue *)0x15b213);
  }
  else if (in_ESI == 1) {
    QVar2 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    s_00.m_size._0_4_ = in_stack_ffffffffffffff08;
    s_00.m_data = (char *)in_stack_ffffffffffffff00;
    s_00.m_size._4_4_ = in_ESI;
    QJsonValue::QJsonValue(in_stack_fffffffffffffee8,s_00);
    Qt::Literals::StringLiterals::operator____L1((char *)in_stack_fffffffffffffef8,(size_t)in_RDI);
    QJsonObject::operator[]((QJsonObject *)in_stack_fffffffffffffef8,QVar2);
    QJsonValueRef::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    QJsonValue::~QJsonValue((QJsonValue *)0x15b35d);
  }
  else if (in_ESI == 2) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    s.m_size._0_4_ = in_stack_ffffffffffffff08;
    s.m_data = (char *)in_stack_ffffffffffffff00;
    s.m_size._4_4_ = in_ESI;
    QJsonValue::QJsonValue(in_stack_fffffffffffffee8,s);
    Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,in_stack_fffffffffffffef0);
    QJsonObject::operator[]((QJsonObject *)in_RDI,in_stack_ffffffffffffff20);
    QJsonValueRef::operator=(in_stack_ffffffffffffff00,in_RDI);
    QJsonValue::~QJsonValue((QJsonValue *)0x15b2b8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void FunctionDef::accessToJson(QJsonObject *obj, FunctionDef::Access acs)
{
    switch (acs) {
    case Private: (*obj)["access"_L1] = "private"_L1; break;
    case Public: (*obj)["access"_L1] = "public"_L1; break;
    case Protected: (*obj)["access"_L1] = "protected"_L1; break;
    }
}